

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O1

void __thiscall CompileCommandParser::ParseTranslationUnits(CompileCommandParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_68;
  vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  local_48;
  
  local_68._M_dataplus._M_p =
       (pointer)(this->TranslationUnits).
                super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_68._M_string_length =
       (size_type)
       (this->TranslationUnits).
       super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.field_2._M_allocated_capacity =
       (size_type)
       (this->TranslationUnits).
       super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->TranslationUnits).
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TranslationUnits).
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TranslationUnits).
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ::~vector((vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
             *)&local_68);
  std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ::~vector(&local_48);
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"at start of compile command file\n","");
  ExpectOrDie(this,'[',&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,(ulong)(local_68.field_2._M_allocated_capacity + 1));
  }
  do {
    ParseTranslationUnit(this);
    std::
    vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>::
    push_back(&this->TranslationUnits,&this->Command);
    if (this->C != ',') {
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"at end of array","");
      ExpectOrDie(this,']',&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,
                        (ulong)(local_68.field_2._M_allocated_capacity + 1));
      }
      return;
    }
    do {
      Next(this);
      if (0x20 < (ulong)(byte)this->C) break;
    } while ((0x100002600U >> ((ulong)(byte)this->C & 0x3f) & 1) != 0);
  } while( true );
}

Assistant:

void ParseTranslationUnits()
  {
    this->TranslationUnits = TranslationUnitsType();
    ExpectOrDie('[', "at start of compile command file\n");
    do
      {
      ParseTranslationUnit();
      this->TranslationUnits.push_back(this->Command);
      } while(Expect(','));
    ExpectOrDie(']', "at end of array");
  }